

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb4Nonlin.c
# Opt level: O1

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes(Aig_Man_t *pAig,int nFans)

{
  ulong *puVar1;
  uint uVar2;
  void *pvVar3;
  ulong uVar4;
  int iVar5;
  long lVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  Vec_Ptr_t *pVVar9;
  uint uVar10;
  int iVar11;
  
  Aig_ManCleanMarkA(pAig);
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar6];
      if (pvVar3 != (void *)0x0) {
        uVar4 = *(ulong *)((long)pvVar3 + 0x18);
        if ((nFans <= (int)((uint)(uVar4 >> 6) & 0x3ffffff)) && (0xfffffffd < ((uint)uVar4 & 7) - 7)
           ) {
          *(ulong *)((long)pvVar3 + 0x18) = uVar4 | 0x10;
        }
      }
      lVar6 = lVar6 + 1;
      pVVar9 = pAig->vObjs;
    } while (lVar6 < pVVar9->nSize);
  }
  if (0 < pAig->nRegs) {
    iVar5 = 0;
    do {
      uVar10 = pAig->nTruePos + iVar5;
      if (((int)uVar10 < 0) || (pAig->vCos->nSize <= (int)uVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      puVar1 = (ulong *)((*(ulong *)((long)pAig->vCos->pArray[uVar10] + 8) & 0xfffffffffffffffe) +
                        0x18);
      *puVar1 = *puVar1 & 0xffffffffffffffef;
      iVar5 = iVar5 + 1;
    } while (iVar5 < pAig->nRegs);
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  pVVar7->nCap = 100;
  pVVar7->nSize = 0;
  piVar8 = (int *)malloc(400);
  pVVar7->pArray = piVar8;
  pVVar9 = pAig->vObjs;
  if (0 < pVVar9->nSize) {
    lVar6 = 0;
    do {
      pvVar3 = pVVar9->pArray[lVar6];
      if (((pvVar3 != (void *)0x0) && ((*(ulong *)((long)pvVar3 + 0x18) & 0x10) != 0)) &&
         (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
        iVar5 = *(int *)((long)pvVar3 + 0x24);
        uVar10 = pVVar7->nSize;
        uVar2 = pVVar7->nCap;
        if (uVar10 == uVar2) {
          if ((int)uVar2 < 0x10) {
            if (pVVar7->pArray == (int *)0x0) {
              piVar8 = (int *)malloc(0x40);
            }
            else {
              piVar8 = (int *)realloc(pVVar7->pArray,0x40);
            }
            pVVar7->pArray = piVar8;
            iVar11 = 0x10;
          }
          else {
            iVar11 = uVar2 * 2;
            if (iVar11 <= (int)uVar2) goto LAB_0082a0d3;
            if (pVVar7->pArray == (int *)0x0) {
              piVar8 = (int *)malloc((ulong)uVar2 << 3);
            }
            else {
              piVar8 = (int *)realloc(pVVar7->pArray,(ulong)uVar2 << 3);
            }
            pVVar7->pArray = piVar8;
          }
          if (piVar8 == (int *)0x0) {
            __assert_fail("p->pArray",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
          }
          pVVar7->nCap = iVar11;
        }
LAB_0082a0d3:
        pVVar7->nSize = uVar10 + 1;
        pVVar7->pArray[(int)uVar10] = iVar5;
      }
      lVar6 = lVar6 + 1;
      pVVar9 = pAig->vObjs;
    } while (lVar6 < pVVar9->nSize);
  }
  Aig_ManCleanMarkA(pAig);
  return pVVar7;
}

Assistant:

Vec_Int_t * Llb_Nonlin4CollectHighRefNodes( Aig_Man_t * pAig, int nFans )
{
    Vec_Int_t * vNodes;
    Aig_Obj_t * pObj;
    int i;
    Aig_ManCleanMarkA( pAig );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( Aig_ObjRefs(pObj) >= nFans )
            pObj->fMarkA = 1;
    // unmark flop drivers
    Saig_ManForEachLi( pAig, pObj, i )
        Aig_ObjFanin0(pObj)->fMarkA = 0;
    // collect mapping
    vNodes = Vec_IntAlloc( 100 );
    Aig_ManForEachNode( pAig, pObj, i )
        if ( pObj->fMarkA )
            Vec_IntPush( vNodes, Aig_ObjId(pObj) );
    Aig_ManCleanMarkA( pAig );
    return vNodes;
}